

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O1

void alf_one_blk_chroma_u_or_v
               (pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
               int sample_bit_depth)

{
  pel *ppVar1;
  pel *ppVar2;
  int iVar3;
  pel *ppVar4;
  pel *ppVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  int iVar10;
  pel *ppVar11;
  pel *ppVar12;
  pel *local_c0;
  pel *local_b8;
  pel *local_b0;
  pel *local_a8;
  pel *local_80;
  
  if (0 < lcu_height) {
    iVar3 = -1 << ((byte)sample_bit_depth & 0x1f);
    uVar7 = 0;
    local_80 = dst;
    do {
      ppVar1 = src + i_src;
      ppVar2 = src + -(long)i_src;
      ppVar4 = src + i_src * 2;
      ppVar5 = src + -(long)(i_src * 2);
      local_a8 = src + i_src * 3;
      ppVar11 = ppVar2;
      ppVar12 = ppVar1;
      local_b8 = ppVar4;
      local_b0 = ppVar5;
      if (uVar7 < 3) {
        ppVar11 = src;
        local_c0 = src;
        local_b0 = src;
        if ((uVar7 != 0) && (ppVar11 = ppVar2, local_c0 = ppVar5, local_b0 = ppVar5, uVar7 == 1)) {
          local_c0 = ppVar2;
          local_b0 = ppVar2;
        }
      }
      else {
        local_c0 = src + -(long)(i_src * 3);
        if (((lcu_height + -4 < (int)uVar7) &&
            (ppVar12 = src, local_b8 = src, local_a8 = src, uVar7 != lcu_height - 1U)) &&
           (ppVar12 = ppVar1, local_b8 = ppVar4, local_a8 = ppVar4, uVar7 == lcu_height - 2U)) {
          local_b8 = ppVar1;
          local_a8 = ppVar1;
        }
      }
      if (0 < lcu_width * 2) {
        lVar6 = 0;
        do {
          iVar8 = (int)(-0x21 - ((uint)src[lVar6] * coef[0x10] +
                                 ((uint)src[lVar6 + -6] + (uint)src[lVar6 + 6]) * coef[10] +
                                ((uint)src[lVar6 + -4] + (uint)src[lVar6 + 4]) * coef[0xc] +
                                ((uint)src[lVar6 + -2] + (uint)src[lVar6 + 2]) * coef[0xe] +
                                ((uint)ppVar11[lVar6 + 2] + (uint)ppVar12[lVar6 + -2]) * coef[8] +
                                ((uint)ppVar11[lVar6] + (uint)ppVar12[lVar6]) * coef[6] +
                                ((uint)ppVar11[lVar6 + -2] + (uint)ppVar12[lVar6 + 2]) * coef[4] +
                                ((uint)local_b0[lVar6] + (uint)local_b8[lVar6]) * coef[2] +
                                ((uint)local_c0[lVar6] + (uint)local_a8[lVar6]) * *coef)) >> 6;
          iVar10 = iVar3;
          if (iVar3 <= iVar8) {
            iVar10 = iVar8;
          }
          bVar9 = ~(byte)iVar10;
          if (-1 < iVar8) {
            bVar9 = 0;
          }
          local_80[lVar6] = bVar9;
          lVar6 = lVar6 + 2;
        } while (lVar6 < lcu_width * 2);
      }
      local_80 = local_80 + i_dst;
      uVar7 = uVar7 + 1;
      src = ppVar1;
    } while (uVar7 != lcu_height);
  }
  return;
}

Assistant:

static void alf_one_blk_chroma_u_or_v(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;

    int i, j;
    int startPos = 0;
    int endPos = lcu_height;

    for (i = startPos; i < endPos; i++)
    {
        p1 = src + i_src;
        p2 = src - i_src;
        p3 = src + 2 * i_src;
        p4 = src - 2 * i_src;
        p5 = src + 3 * i_src;
        p6 = src - 3 * i_src;
        if (i < 3) {
            if (i == 0) {
                p4 = p2 = src;
            }
            else if (i == 1) {
                p4 = p2;
            }
            p6 = p4;
        }
        else if (i > lcu_height - 4) {
            if (i == lcu_height - 1) {
                p3 = p1 = src;
            }
            else if (i == lcu_height - 2) {
                p3 = p1;
            }
            p5 = p3;
        }

        for (j = 0; j < lcu_width << 1; j += 2)
        {
            int sum;
            int xLeft = j - 2;
            int xRight = j + 2;

            sum = coef[0] * (p5[j] + p6[j]);
            sum += coef[2] * (p3[j] + p4[j]);
            sum += coef[4] * (p1[xRight] + p2[xLeft]);
            sum += coef[6] * (p1[j] + p2[j]);
            sum += coef[8] * (p1[xLeft] + p2[xRight]);
            sum += coef[14] * (src[xRight] + src[xLeft]);

            xLeft = j - 4;
            xRight = j + 4;
            sum += coef[12] * (src[xRight] + src[xLeft]);

            xLeft = j - 6;
            xRight = j + 6;
            sum += coef[10] * (src[xRight] + src[xLeft]);

            sum += coef[16] * (src[j]);

            sum = (int)((sum + 32) >> 6);

            dst[j] = COM_CLIP3(0, ((1 << sample_bit_depth) - 1), sum);

        }
        src += i_src;
        dst += i_dst;
    }
}